

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

int __thiscall
absl::lts_20250127::synchronization_internal::MutexDelay
          (synchronization_internal *this,int32_t c,int mode)

{
  int iVar1;
  uint in_EAX;
  undefined8 extraout_RAX;
  undefined4 in_register_00000014;
  anon_class_1_0_00000001 *fn;
  anon_class_1_0_00000001 *extraout_RDX;
  int iVar2;
  SchedulingMode scheduling_mode;
  Duration duration;
  ScopedEnable enable_rescheduling;
  undefined8 uStack_18;
  
  fn = (anon_class_1_0_00000001 *)CONCAT44(in_register_00000014,mode);
  scheduling_mode = c;
  uStack_18._0_4_ = in_EAX;
  if (lts_20250127::(anonymous_namespace)::globals != 0xdd) {
    base_internal::CallOnceImpl<absl::lts_20250127::(anonymous_namespace)::GetMutexGlobals()::__0>
              ((Nonnull<std::atomic<uint32_t>_*>)&lts_20250127::(anonymous_namespace)::globals,c,fn)
    ;
    fn = extraout_RDX;
  }
  iVar1 = *(int *)(&DAT_00599fc8 + (long)c * 4);
  if (lts_20250127::(anonymous_namespace)::globals != 0xdd) {
    base_internal::CallOnceImpl<absl::lts_20250127::(anonymous_namespace)::GetMutexGlobals()::__0>
              ((Nonnull<std::atomic<uint32_t>_*>)&lts_20250127::(anonymous_namespace)::globals,
               scheduling_mode,fn);
  }
  iVar2 = (int)this;
  if (iVar2 < iVar1) {
    iVar2 = iVar2 + 1;
  }
  else {
    uStack_18 = (ulong)(uint)uStack_18;
    if (iVar1 == iVar2) {
      AbslInternalMutexYield_lts_20250127();
      iVar2 = iVar2 + 1;
    }
    else {
      iVar2 = 0;
      duration.rep_lo_ = DAT_00599fd8;
      duration.rep_hi_ = DAT_00599fd0;
      AbslInternalSleepFor_lts_20250127(duration);
    }
    if (uStack_18._4_4_ != 0) {
      raw_log_internal::RawLog
                (kFatal,"low_level_scheduling.h",0x7f,"Check %s failed: %s",
                 "scheduling_disabled_depth_ == 0","disable unused warning");
      MutexDelay();
      base_internal::SchedulingGuard::ScopedEnable::~ScopedEnable
                ((ScopedEnable *)((long)&uStack_18 + 4));
      _Unwind_Resume(extraout_RAX);
    }
  }
  return iVar2;
}

Assistant:

int MutexDelay(int32_t c, int mode) {
  const int32_t limit = GetMutexGlobals().mutex_sleep_spins[mode];
  const absl::Duration sleep_time = GetMutexGlobals().mutex_sleep_time;
  if (c < limit) {
    // Spin.
    c++;
  } else {
    SchedulingGuard::ScopedEnable enable_rescheduling;
    ABSL_TSAN_MUTEX_PRE_DIVERT(nullptr, 0);
    if (c == limit) {
      // Yield once.
      ABSL_INTERNAL_C_SYMBOL(AbslInternalMutexYield)();
      c++;
    } else {
      // Then wait.
      absl::SleepFor(sleep_time);
      c = 0;
    }
    ABSL_TSAN_MUTEX_POST_DIVERT(nullptr, 0);
  }
  return c;
}